

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O1

char * __thiscall VPLGrammar::Parser::IfStatementNode::GetName(IfStatementNode *this)

{
  return "IfStatement";
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                int unique_id = scope->GetUnique();

                out << "func .L" << unique_id << "_if\n";
                children_[0]->BuildProgram(scope, out);
                out << "    jz .L" << unique_id << "_else\n";

                out << "func .L" << unique_id << "_then\n";
                out << "    pop 0\n";
                children_[1]->BuildProgram(scope, out);
                out << "    jmp .L" << unique_id << "_end\n";

                out << "func .L" << unique_id << "_else\n";
                out << "    pop 0\n";
                if (children_.size() == 3) {
                    children_[2]->BuildProgram(scope, out);
                }

                out << "func .L" << unique_id << "_end\n";
            }